

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

bool Js::JavascriptLibrary::InitializeAsyncGeneratorFunction
               (DynamicObject *instance,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  JavascriptFunction *this_00;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  JavascriptFunction *instance_00;
  Type *pTVar5;
  DynamicObject *pDVar6;
  undefined4 *puVar7;
  JavascriptString *local_38;
  JavascriptString *functionName;
  Var varLength;
  
  instance_00 = (JavascriptFunction *)
                VarTo<Js::JavascriptAsyncGeneratorFunction,Js::DynamicObject>(instance);
  iVar3 = (*(instance_00->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x77])(instance_00);
  this = (((instance_00->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
         ptr;
  pTVar5 = &this->functionWithPrototypeAndLengthTypeHandler;
  if ((char)iVar3 != '\0') {
    pTVar5 = &this->anonymousFunctionWithPrototypeTypeHandler;
  }
  DeferredTypeHandlerBase::ConvertFunction(typeHandler,instance_00,pTVar5->ptr);
  pDVar6 = CreateAsyncGeneratorConstructorPrototypeObject(this);
  (*(instance_00->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (instance_00,0x124,pDVar6,4,0,0,0xf);
  this_00 = (JavascriptFunction *)
            instance_00[1].super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject;
  iVar4 = (**(code **)(*(long *)&(this_00->super_DynamicObject).super_RecyclableObject + 0x90))
                    (this_00,this_00,0xd1,&functionName,0,
                     (((((this_00->super_DynamicObject).super_RecyclableObject.type.ptr)->
                       javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr);
  if (iVar4 != 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x366,"(false)",
                                "Initializing Async Generator function without a length property - why isn\'t there a length?."
                               );
    if (!bVar2) goto LAB_00a966e2;
    *puVar7 = 0;
    functionName = (JavascriptString *)&DAT_1000000000000;
  }
  (*(instance_00->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (instance_00,0xd1,functionName,2,0,0,0);
  if ((char)iVar3 == '\0') {
    local_38 = (JavascriptString *)0x0;
    bVar2 = JavascriptFunction::GetFunctionName(this_00,&local_38);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                  ,0x36f,"(status)","status");
      if (!bVar2) {
LAB_00a966e2:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar7 = 0;
    }
    (*(instance_00->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
              (instance_00,0x106,local_38,2,0,0,0xf);
  }
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeAsyncGeneratorFunction(DynamicObject *instance, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        JavascriptGeneratorFunction *function = VarTo<JavascriptAsyncGeneratorFunction>(instance);
        bool isAnonymousFunction = function->IsAnonymousFunction();

        JavascriptLibrary* javascriptLibrary = function->GetType()->GetLibrary();
        typeHandler->ConvertFunction(function, isAnonymousFunction ? javascriptLibrary->anonymousFunctionWithPrototypeTypeHandler : javascriptLibrary->functionWithPrototypeAndLengthTypeHandler);
        function->SetPropertyWithAttributes(PropertyIds::prototype, javascriptLibrary->CreateAsyncGeneratorConstructorPrototypeObject(), PropertyWritable, nullptr);

        Var varLength;
        GeneratorVirtualScriptFunction* scriptFunction = function->GetGeneratorVirtualScriptFunction();
        if (!scriptFunction->GetProperty(scriptFunction, PropertyIds::length, &varLength, nullptr, scriptFunction->GetScriptContext()))
        {
            // TODO - remove this if or convert it to a FailFast if this assert never triggers
            // Nothing in the ChakraCore CI will reach this code
            AssertMsg(false, "Initializing Async Generator function without a length property - why isn't there a length?.");
            varLength = TaggedInt::ToVarUnchecked(0);
        }
        function->SetPropertyWithAttributes(PropertyIds::length, varLength, PropertyConfigurable, nullptr, PropertyOperation_None, SideEffects_None);

        if (!isAnonymousFunction)
        {
            JavascriptString * functionName = nullptr;
            DebugOnly(bool status = ) ((Js::JavascriptFunction*)scriptFunction)->GetFunctionName(&functionName);
            Assert(status);
            function->SetPropertyWithAttributes(PropertyIds::name,functionName, PropertyConfigurable, nullptr);
        }

        return true;
    }